

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O1

void stringcache_destroy(StringCache *cache)

{
  StringBucket *__ptr;
  StringBucket *pSVar1;
  ulong uVar2;
  
  if (cache == (StringCache *)0x0) {
    return;
  }
  if (cache->table_size != 0) {
    uVar2 = 0;
    do {
      __ptr = cache->hashtable[uVar2];
      cache->hashtable[uVar2] = (StringBucket *)0x0;
      while (__ptr != (StringBucket *)0x0) {
        pSVar1 = __ptr->next;
        free(__ptr);
        __ptr = pSVar1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < cache->table_size);
  }
  free(cache->hashtable);
  free(cache);
  return;
}

Assistant:

void stringcache_destroy(StringCache *cache)
{
    size_t i;

    if (cache == NULL)
        return;

    for (i = 0; i < cache->table_size; i++)
    {
        StringBucket *bucket = cache->hashtable[i];
        cache->hashtable[i] = NULL;
        while (bucket)
        {
            StringBucket *next = bucket->next;
            free(bucket);
            bucket = next;
        } // while
    } // for

    free(cache->hashtable);
    free(cache);
}